

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O3

int __thiscall
IDisk::AddMFMByteToSpecificTrack
          (IDisk *this,int side,int track,int rev,uint index,uchar byte,int datasize)

{
  Revolution *pRVar1;
  ulong uVar2;
  
  if (0 < datasize) {
    do {
      datasize = datasize - 1;
      pRVar1 = this->side_[side].tracks[track].revolution;
      uVar2 = (ulong)index;
      if (pRVar1[rev].size <= index) {
        uVar2 = 0;
      }
      pRVar1[rev].bitfield[uVar2] = (byte >> (datasize & 0x1fU) & 1) != 0;
      index = (int)uVar2 + 1;
    } while (datasize != 0);
    return index;
  }
  return index;
}

Assistant:

int IDisk::AddMFMByteToSpecificTrack(int side, int track, int rev, unsigned int index, unsigned char byte, int datasize)
{
   for (int d = 0; d < datasize; d++)
   {
      if (index >= side_[side].tracks[track].revolution[rev].size)
      {
         index = 0;
      }
      side_[side].tracks[track].revolution[rev].bitfield[index++] = ((byte >> (datasize - 1 - d)) & 0x01);
   }
   return index;
}